

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::filter::filter
          (filter *this,string_view filter)

{
  pointer *ppbVar1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  uVar3 = filter._M_len;
  (this->path_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0;
  do {
    uVar2 = uVar3 - uVar5;
    uVar4 = uVar5;
    if (uVar3 < uVar5 || uVar2 == 0) {
      return;
    }
    do {
      if (filter._M_str[uVar4] == '.') goto LAB_0010bffc;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    uVar4 = 0xffffffffffffffff;
LAB_0010bffc:
    local_38._M_len = uVar4 - uVar5;
    if (local_38._M_len != 0) {
      if (uVar2 < local_38._M_len) {
        local_38._M_len = uVar2;
      }
      local_38._M_str = filter._M_str + uVar5;
      __position._M_current =
           (this->path_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->path_).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)this,__position,&local_38);
      }
      else {
        (__position._M_current)->_M_len = local_38._M_len;
        (__position._M_current)->_M_str = local_38._M_str;
        ppbVar1 = &(this->path_).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
    }
    uVar5 = uVar4 + 1;
    if (uVar5 == 0) {
      return;
    }
  } while( true );
}

Assistant:

constexpr /*explicit(false)*/ filter(std::string_view filter = {})
          : path_{utility::split(filter, delim)} {}